

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

Vec_Int_t * Saig_ManCbaReason2Inputs(Saig_ManCba_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  void *__s;
  int iVar4;
  long lVar5;
  
  iVar1 = p->pAig->nTruePis;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    p_00->pArray = (int *)0x0;
    __s = (void *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
    p_00->pArray = piVar3;
    __s = malloc((long)iVar4 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  if (0 < vReasons->nSize) {
    lVar5 = 0;
    do {
      if (vReasons->pArray[lVar5] < 0) {
LAB_00606586:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vReasons->pArray[lVar5] * 2;
      if (p->vMapPiF2A->nSize <= (int)uVar2) goto LAB_00606586;
      uVar2 = p->vMapPiF2A->pArray[uVar2];
      if (((int)uVar2 < p->nInputs) || (p->pAig->nObjs[2] <= (int)uVar2)) {
        __assert_fail("iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0xcc,"Vec_Int_t *Saig_ManCbaReason2Inputs(Saig_ManCba_t *, Vec_Int_t *)");
      }
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) goto LAB_00606586;
      if (*(int *)((long)__s + (ulong)uVar2 * 4) == 0) {
        Vec_IntPush(p_00,uVar2 - p->nInputs);
      }
      piVar3 = (int *)((long)__s + (ulong)uVar2 * 4);
      *piVar3 = *piVar3 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vReasons->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Saig_ManCbaReason2Inputs( Saig_ManCba_t * p, Vec_Int_t * vReasons )
{
    Vec_Int_t * vOriginal, * vVisited;
    int i, Entry;
    vOriginal = Vec_IntAlloc( Saig_ManPiNum(p->pAig) ); 
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        assert( iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig) );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            Vec_IntPush( vOriginal, iInput - p->nInputs );
        Vec_IntAddToEntry( vVisited, iInput, 1 );
    }
    Vec_IntFree( vVisited );
    return vOriginal;
}